

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kcpu.h
# Opt level: O2

void m68ki_write_8_fc(uint address,uint fc,uint value)

{
  my_fc_handler(fc);
  if (m68ki_cpu.pmmu_enabled != 0) {
    address = pmmu_translate_addr(address);
  }
  m68k_write_memory_8(address & m68ki_cpu.address_mask,value);
  return;
}

Assistant:

static inline void m68ki_write_8_fc(uint address, uint fc, uint value)
{
	(void)fc;
	m68ki_set_fc(fc); /* auto-disable (see m68kcpu.h) */

#if M68K_EMULATE_PMMU
	if (PMMU_ENABLED)
	    address = pmmu_translate_addr(address);
#endif

	m68k_write_memory_8(ADDRESS_68K(address), value);
}